

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml.cpp
# Opt level: O2

void __thiscall TiXmlText::CopyTo(TiXmlText *this,TiXmlText *target)

{
  TiXmlNode::CopyTo(&this->super_TiXmlNode,&target->super_TiXmlNode);
  target->cdata = this->cdata;
  return;
}

Assistant:

void TiXmlText::CopyTo( TiXmlText* target ) const
{
	TiXmlNode::CopyTo( target );
	target->cdata = cdata;
}